

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

int has_ext(char *ext)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDI;
  char *terminator;
  char *loc;
  char *extensions;
  char *local_18;
  int local_4;
  
  local_18 = exts;
  if ((exts == (char *)0x0) || (in_RDI == (char *)0x0)) {
    local_4 = 0;
  }
  else {
    do {
      pcVar1 = strstr(local_18,in_RDI);
      if (pcVar1 == (char *)0x0) {
        return 0;
      }
      sVar2 = strlen(in_RDI);
      pcVar3 = pcVar1 + sVar2;
    } while (((pcVar1 != local_18) && (local_18 = pcVar3, pcVar1[-1] != ' ')) ||
            ((*pcVar3 != ' ' && (local_18 = pcVar3, *pcVar3 != '\0'))));
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}